

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
TwoValuesWithHashCollision_LeafLevelTenCollision_Test::TestBody
          (TwoValuesWithHashCollision_LeafLevelTenCollision_Test *this)

{
  bool bVar1;
  uint generation;
  type phVar2;
  Message *pMVar3;
  char *pcVar4;
  pointer phVar5;
  index_pointer *piVar6;
  internal_node *piVar7;
  typed_address<pstore::index::details::internal_node> tVar8;
  element_type *peVar9;
  char *in_R9;
  string local_750;
  AssertHelper local_730;
  Message local_728;
  allocator local_719;
  string local_718;
  bool local_6f1;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_6c0;
  Message local_6b8;
  allocator local_6a9;
  string local_6a8;
  bool local_681;
  undefined1 local_680 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_660;
  Message local_658;
  uint local_64c;
  hash_type local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_628 [8];
  shared_ptr<const_pstore::index::details::internal_node> level10_internal_1;
  index_pointer level10;
  undefined1 local_608 [8];
  shared_ptr<const_pstore::index::details::internal_node> level9_internal_1;
  index_pointer level9;
  undefined1 local_5e8 [8];
  shared_ptr<const_pstore::index::details::internal_node> level8_internal_1;
  index_pointer level8;
  undefined1 local_5c8 [8];
  shared_ptr<const_pstore::index::details::internal_node> level7_internal_1;
  index_pointer level7;
  undefined1 local_5a8 [8];
  shared_ptr<const_pstore::index::details::internal_node> level6_internal_1;
  index_pointer level6;
  Message local_588;
  uint local_57c;
  hash_type local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_558 [8];
  shared_ptr<const_pstore::index::details::internal_node> level5_internal_1;
  index_pointer level5;
  undefined1 local_538 [8];
  shared_ptr<const_pstore::index::details::internal_node> level4_internal_1;
  index_pointer level4;
  undefined1 local_518 [8];
  shared_ptr<const_pstore::index::details::internal_node> level3_internal_1;
  index_pointer level3;
  undefined1 local_4f8 [8];
  shared_ptr<const_pstore::index::details::internal_node> level2_internal_1;
  index_pointer level2;
  undefined1 local_4d8 [8];
  shared_ptr<const_pstore::index::details::internal_node> level1_internal_1;
  index_pointer level1;
  undefined1 local_4b8 [8];
  shared_ptr<const_pstore::index::details::internal_node> root_internal_1;
  index_pointer local_4a0;
  index_pointer root_1;
  index_pointer local_490;
  index_pointer local_488;
  AssertHelper local_480;
  Message local_478;
  uint local_46c;
  hash_type local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_2;
  internal_node *level10_internal;
  internal_node *level9_internal;
  internal_node *level8_internal;
  internal_node *level7_internal;
  internal_node *level6_internal;
  Message local_420;
  uint local_414;
  hash_type local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  internal_node *level5_internal;
  internal_node *level4_internal;
  internal_node *level3_internal;
  internal_node *level2_internal;
  internal_node *level1_internal;
  Message local_3c8;
  uint local_3bc;
  hash_type local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar;
  internal_node *root_internal;
  index_pointer local_390;
  index_pointer root;
  AssertHelper local_368;
  Message local_360;
  allocator local_351;
  string local_350;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2f8;
  Message local_2f0;
  allocator local_2e1;
  string local_2e0;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_;
  string local_2a0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_280;
  allocator local_181;
  string local_180;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_160;
  unique_lock<mock_mutex> local_58;
  undefined1 local_48 [8];
  transaction_type t1;
  TwoValuesWithHashCollision_LeafLevelTenCollision_Test *this_local;
  
  t1.lock_._8_8_ = this;
  std::unique_lock<mock_mutex>::unique_lock
            (&local_58,
             (mutex_type *)
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_48,
          &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_
          ,&local_58);
  std::unique_lock<mock_mutex>::~unique_lock(&local_58);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"e",&local_181);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_160,phVar2,(transaction_type *)local_48,&local_180);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2a0,"f",
             (allocator *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_280,phVar2,(transaction_type *)local_48,&local_2a0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"e",&local_2e1);
  local_2b9 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_2e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pMVar3 = testing::Message::operator<<
                       (&local_2f0,(char (*) [39])"key \"e\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2b8,
               (AssertionResult *)"this->is_found (*index_, \"e\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"f",&local_351);
  local_329 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_350);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pMVar3 = testing::Message::operator<<
                       (&local_360,(char (*) [39])"key \"f\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&root.addr_,(internal *)local_328,
               (AssertionResult *)"this->is_found (*index_, \"f\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3de,pcVar4);
    testing::internal::AssertHelper::operator=(&local_368,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&root.addr_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  phVar5 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_TwoValuesWithHashCollision).index_);
  local_390 = pstore::index::
              hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::root(phVar5);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)this,local_390);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&local_390.addr_);
  local_3b8 = pstore::index::details::internal_node::get_bitmap
                        ((internal_node *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_3bc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_3b0,"root_internal->get_bitmap ()","0b1U",&local_3b8,&local_3bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level1_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3e4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&level1_internal,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level1_internal);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&piVar6->addr_);
  local_410 = pstore::index::details::internal_node::get_bitmap
                        ((internal_node *)
                         gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_414 = 0x20;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_408,"level5_internal->get_bitmap ()","0b100000U",&local_410,
             &local_414);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level6_internal,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3eb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&level6_internal,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level6_internal);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  piVar7 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar6->addr_);
  piVar6 = pstore::index::details::internal_node::operator[](piVar7,0);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&piVar6->addr_);
  local_468 = pstore::index::details::internal_node::get_bitmap
                        ((internal_node *)
                         gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_46c = 0x9000;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_460,"level10_internal->get_bitmap ()","0b1001000000000000U",
             &local_468,&local_46c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x3f2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  local_488 = *piVar6;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)this,local_488);
  piVar6 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,1);
  local_490 = *piVar6;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)this,local_490);
  phVar5 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_TwoValuesWithHashCollision).index_);
  generation = pstore::database::get_current_revision
                         (&(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.
                           super_IndexFixture.db_);
  root_1.addr_.a_ =
       (address)pstore::index::
                hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::flush(phVar5,(transaction_base *)local_48,generation);
  phVar5 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_TwoValuesWithHashCollision).index_);
  root_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       pstore::index::
       hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::root(phVar5);
  local_4a0 = (index_pointer)
              root_internal_1.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)this,
             (index_pointer)
             root_internal_1.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)&local_4a0.addr_);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_4b8,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_4b8);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level1_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level1_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_4d8,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_4d8);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level2_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level2_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_4f8,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_4f8);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level3_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level3_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_518,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_518);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level4_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level4_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_538,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_538);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level5_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::
         untag_address<pstore::index::details::internal_node,void>
                   ((index_pointer *)
                    &level5_internal_1.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_558,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,(typed_address<pstore::index::details::internal_node>)
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_558);
  local_578 = pstore::index::details::internal_node::get_bitmap(peVar9);
  local_57c = 0x20;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_570,"level5_internal->get_bitmap ()","0b100000U",&local_578,
             &local_57c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&level6.addr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x40d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&level6.addr_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&level6.addr_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_558);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level6_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level6_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_5a8,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_5a8);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level7_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level7_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_5c8,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_5c8);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level8_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level8_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_5e8,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_5e8);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level9_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level9_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_608,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_608);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  level10_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar6->addr_).a_;
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::
         untag_address<pstore::index::details::internal_node,void>
                   ((index_pointer *)
                    &level10_internal_1.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_628,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,(typed_address<pstore::index::details::internal_node>)
                  gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_628);
  local_648 = pstore::index::details::internal_node::get_bitmap(peVar9);
  local_64c = 0x9000;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_640,"level10_internal->get_bitmap ()","0b10010000\'00000000U",
             &local_648,&local_64c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x41d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_628);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,0);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)this,*piVar6);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_628);
  piVar6 = pstore::index::details::internal_node::operator[](peVar9,1);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         *)piVar6;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_leaf_node
            ((GenericIndexFixture *)this,
             (index_pointer)
             gtest_ar__2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a8,"e",&local_6a9);
  local_681 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_6a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_680,&local_681,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pMVar3 = testing::Message::operator<<
                       (&local_6b8,(char (*) [39])"key \"e\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_680,
               (AssertionResult *)"this->is_found (*index_, \"e\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x420,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6c0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_718,"f",&local_719);
  local_6f1 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_718);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f0,&local_6f1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pMVar3 = testing::Message::operator<<
                       (&local_728,(char (*) [39])"key \"f\" should be present in the index");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_750,(internal *)local_6f0,(AssertionResult *)"this->is_found (*index_, \"f\")"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x421,pcVar4);
    testing::internal::AssertHelper::operator=(&local_730,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_628);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_608);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_5e8);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_5c8);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_5a8);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_558);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_538);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_518);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_4f8);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_4d8);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_4b8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_48);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LeafLevelTenCollision) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});

    // First insert_or_assign should be very conventional. The result will be a trie whose root
    // points to an address of the "first" string. Second insert_or_assign should trigger the
    // insertion of an additional internal node in the trie. This unit test checks the
    // insert_into_leaf function.
    //
    //              +--------+
    // root_ ->     | 000000 |       (hash bits 0-5)
    //              +--------+
    //                   |
    //                   v
    //              +--------+
    // level1 ->    | 000001 |       (hash bits 6-11)
    //              +--------+
    //                   |
    //                   :
    //                   |
    //                   v
    //              +--------+
    // level9 ->    | 001001 |       (hash bits 54-59)
    //              +--------+
    //                   |
    //                   v
    //           +--------+--------+
    // level10-> | 001100 | 001111 |  (hash bits 60-63)
    //           +--------+--------+
    //                |       |
    //                v       |
    //               "e"      v       (0b1100 001001 001000 000111 000110 000101 000100 000011
    //               000010 000001 000000)
    //                       "f"      (0b1111 001001 001000 000111 000110 000101 000100 000011
    //                       000010 000001 000000)

    this->insert_or_assign (*index_, t1, "e");
    this->insert_or_assign (*index_, t1, "f");

    EXPECT_TRUE (this->is_found (*index_, "e")) << "key \"e\" should be present in the index";
    EXPECT_TRUE (this->is_found (*index_, "f")) << "key \"f\" should be present in the index";
    {
        // Check that the trie was laid out as we expected in the heap.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b1U);

        auto const level1_internal = (*root_internal)[0].untag<internal_node *> ();
        auto const level2_internal = (*level1_internal)[0].untag<internal_node *> ();
        auto const level3_internal = (*level2_internal)[0].untag<internal_node *> ();
        auto const level4_internal = (*level3_internal)[0].untag<internal_node *> ();
        auto const level5_internal = (*level4_internal)[0].untag<internal_node *> ();
        EXPECT_EQ (level5_internal->get_bitmap (), 0b100000U);

        auto const level6_internal = (*level5_internal)[0].untag<internal_node *> ();
        auto const level7_internal = (*level6_internal)[0].untag<internal_node *> ();
        auto const level8_internal = (*level7_internal)[0].untag<internal_node *> ();
        auto const level9_internal = (*level8_internal)[0].untag<internal_node *> ();
        auto const level10_internal = (*level9_internal)[0].untag<internal_node *> ();
        EXPECT_EQ (level10_internal->get_bitmap (), 0b1001000000000000U);

        this->check_is_leaf_node ((*level10_internal)[0]);
        this->check_is_leaf_node ((*level10_internal)[1]);
        index_->flush (t1, db_.get_current_revision ());
    }
    {
        // Check that the trie was laid out as we expected in the store.
        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);
        auto const root_internal =
            internal_node::read_node (db_, root.untag_address<internal_node> ());
        auto const level1 = (*root_internal)[0];
        auto const level1_internal =
            internal_node::read_node (db_, level1.untag_address<internal_node> ());
        auto const level2 = (*level1_internal)[0];
        auto const level2_internal =
            internal_node::read_node (db_, level2.untag_address<internal_node> ());
        auto const level3 = (*level2_internal)[0];
        auto const level3_internal =
            internal_node::read_node (db_, level3.untag_address<internal_node> ());
        auto const level4 = (*level3_internal)[0];
        auto const level4_internal =
            internal_node::read_node (db_, level4.untag_address<internal_node> ());
        auto const level5 = (*level4_internal)[0];
        auto const level5_internal =
            internal_node::read_node (db_, level5.untag_address<internal_node> ());
        EXPECT_EQ (level5_internal->get_bitmap (), 0b100000U);
        auto const level6 = (*level5_internal)[0];
        auto const level6_internal =
            internal_node::read_node (db_, level6.untag_address<internal_node> ());
        auto const level7 = (*level6_internal)[0];
        auto const level7_internal =
            internal_node::read_node (db_, level7.untag_address<internal_node> ());
        auto const level8 = (*level7_internal)[0];
        auto const level8_internal =
            internal_node::read_node (db_, level8.untag_address<internal_node> ());
        auto const level9 = (*level8_internal)[0];
        auto const level9_internal =
            internal_node::read_node (db_, level9.untag_address<internal_node> ());
        auto const level10 = (*level9_internal)[0];
        auto const level10_internal =
            internal_node::read_node (db_, level10.untag_address<internal_node> ());
        EXPECT_EQ (level10_internal->get_bitmap (), 0b10010000'00000000U);
        this->check_is_leaf_node ((*level10_internal)[0]);
        this->check_is_leaf_node ((*level10_internal)[1]);
        EXPECT_TRUE (this->is_found (*index_, "e")) << "key \"e\" should be present in the index";
        EXPECT_TRUE (this->is_found (*index_, "f")) << "key \"f\" should be present in the index";
    }
}